

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool set_current_path(void)

{
  _Bool _Var1;
  
  _Var1 = get_current_path(g_current_path);
  if (g_verbose == true) {
    console_message_string("Current Path: %s\n",g_current_path);
  }
  if (!_Var1) {
    memset(g_current_path,0,0x104);
  }
  return _Var1;
}

Assistant:

bool set_current_path()
{
	bool res = get_current_path(g_current_path);
	if (g_verbose)
	{
		console_message_string(u8"Current Path: %s\n", g_current_path);
	}
	if (res)
	{
		return true;
	}
	clear_path_string(g_current_path, MAX_PATH);
	return false;
}